

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdMinBase(word *pTruth,int nVars,int *pVarsNew)

{
  int iVar1;
  int local_24;
  int v;
  int *pVarsNew_local;
  int nVars_local;
  word *pTruth_local;
  
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    pVarsNew[local_24] = local_24;
  }
  pVarsNew_local._4_4_ = nVars;
  for (local_24 = nVars + -1; -1 < local_24; local_24 = local_24 + -1) {
    iVar1 = Abc_TtHasVar(pTruth,pVarsNew_local._4_4_,local_24);
    if (iVar1 == 0) {
      Abc_TtSwapVars(pTruth,pVarsNew_local._4_4_,local_24,pVarsNew_local._4_4_ + -1);
      pVarsNew_local._4_4_ = pVarsNew_local._4_4_ + -1;
      pVarsNew[local_24] = pVarsNew[pVarsNew_local._4_4_];
    }
  }
  return pVarsNew_local._4_4_;
}

Assistant:

int Dau_DsdMinBase( word * pTruth, int nVars, int * pVarsNew )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        pVarsNew[v] = v;
    for ( v = nVars - 1; v >= 0; v-- )
    {
        if ( Abc_TtHasVar( pTruth, nVars, v ) )
            continue;
        Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
        pVarsNew[v] = pVarsNew[--nVars];
    }
    return nVars;
}